

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

bool QApplicationPrivate::translateRawTouchEvent(QWidget *window,QTouchEvent *te)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  State SVar4;
  byte bVar5;
  int iVar6;
  Type TVar7;
  QWidget *this;
  iterator o;
  QWidget *pQVar8;
  pair<QEventPoint::State,_QList<QEventPoint>_> *ppVar9;
  QWidget *pQVar10;
  QPointerEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  bool res_1;
  bool res;
  bool containsPress;
  Type eventType;
  bool accepted;
  StatesAndTouchPoints *maskAndPoints;
  QWidget *widget;
  QWidget *closestWidget;
  bool usingClosestWidget;
  QEventPoint *touchPoint;
  QList<QEventPoint> *__range1;
  QPointingDevice *device;
  QApplicationPrivate *d;
  QPointer<QWidget> widget_1;
  ConstIterator end;
  ConstIterator it;
  QWidget *targetWidget;
  QPointer<QObject> target;
  iterator __end1;
  iterator __begin1;
  QList<QEventPoint> touchPoints;
  QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_> widgetsNeedingEvents;
  QMutableTouchEvent touchEvent;
  undefined1 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe59;
  byte in_stack_fffffffffffffe5a;
  byte in_stack_fffffffffffffe5b;
  undefined4 in_stack_fffffffffffffe5c;
  QWidget *in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe68;
  Type in_stack_fffffffffffffe6c;
  QWidget *in_stack_fffffffffffffe70;
  QWidget *in_stack_fffffffffffffe78;
  undefined4 uVar11;
  uint in_stack_fffffffffffffe94;
  QWidget *in_stack_fffffffffffffe98;
  undefined1 **ppuVar12;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  iterator local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_> local_60;
  QMutableTouchEvent local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>::QHash(&local_60);
  this = (QWidget *)QPointerEvent::pointingDevice();
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  QPointerEvent::points(in_RSI);
  QList<QEventPoint>::QList
            ((QList<QEventPoint> *)in_stack_fffffffffffffe60,
             (QList<QEventPoint> *)
             CONCAT44(in_stack_fffffffffffffe5c,
                      CONCAT13(in_stack_fffffffffffffe5b,
                               CONCAT12(in_stack_fffffffffffffe5a,
                                        CONCAT11(in_stack_fffffffffffffe59,in_stack_fffffffffffffe58
                                                )))));
  ppuVar12 = &local_78;
  local_80.i = (QEventPoint *)&DAT_aaaaaaaaaaaaaaaa;
  local_80 = QList<QEventPoint>::begin((QList<QEventPoint> *)in_stack_fffffffffffffe60);
  o = QList<QEventPoint>::end((QList<QEventPoint> *)in_stack_fffffffffffffe60);
  while (bVar1 = QList<QEventPoint>::iterator::operator!=(&local_80,o), bVar1) {
    pQVar10 = (QWidget *)QList<QEventPoint>::iterator::operator*(&local_80);
    QPointer<QObject>::QPointer((QPointer<QObject> *)0x2d527b);
    cVar2 = QEventPoint::state();
    if (cVar2 == '\x01') {
      iVar6 = QInputDevice::type();
      if (iVar6 == 4) {
        QPointingDevicePrivate::get((QPointingDevice *)0x2d52aa);
        QPointingDevicePrivate::firstActiveTarget();
        QPointer<QObject>::operator=
                  ((QPointer<QObject> *)in_stack_fffffffffffffe60,
                   (QObject *)
                   CONCAT44(in_stack_fffffffffffffe5c,
                            CONCAT13(in_stack_fffffffffffffe5b,
                                     CONCAT12(in_stack_fffffffffffffe5a,
                                              CONCAT11(in_stack_fffffffffffffe59,
                                                       in_stack_fffffffffffffe58)))));
      }
      bVar1 = QPointer<QObject>::isNull((QPointer<QObject> *)0x2d52cf);
      if (bVar1) {
        pQVar8 = in_stack_fffffffffffffe78;
        if (in_RDI == (QWidget *)0x0) {
          QEventPoint::globalPosition();
          QPointF::toPoint((QPointF *)in_stack_fffffffffffffe70);
          in_RDI = QApplication::topLevelAt
                             ((QPoint *)
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          pQVar8 = in_stack_fffffffffffffe78;
        }
        in_stack_fffffffffffffe78 = in_RDI;
        in_RDI = in_stack_fffffffffffffe78;
        if (in_stack_fffffffffffffe78 == (QWidget *)0x0) goto LAB_002d5571;
        QEventPoint::globalPosition();
        QPointF::toPoint((QPointF *)in_stack_fffffffffffffe70);
        QWidget::mapFromGlobal
                  (in_stack_fffffffffffffe70,
                   (QPoint *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        QWidget::childAt(in_stack_fffffffffffffe78,(QPoint *)in_stack_fffffffffffffe70);
        QPointer<QObject>::operator=
                  ((QPointer<QObject> *)in_stack_fffffffffffffe60,
                   (QObject *)
                   CONCAT44(in_stack_fffffffffffffe5c,
                            CONCAT13(in_stack_fffffffffffffe5b,
                                     CONCAT12(in_stack_fffffffffffffe5a,
                                              CONCAT11(in_stack_fffffffffffffe59,
                                                       in_stack_fffffffffffffe58)))));
        bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QObject> *)0x2d53d5);
        if (!bVar1) {
          QPointer<QObject>::operator=
                    ((QPointer<QObject> *)in_stack_fffffffffffffe60,
                     (QObject *)
                     CONCAT44(in_stack_fffffffffffffe5c,
                              CONCAT13(in_stack_fffffffffffffe5b,
                                       CONCAT12(in_stack_fffffffffffffe5a,
                                                CONCAT11(in_stack_fffffffffffffe59,
                                                         in_stack_fffffffffffffe58)))));
        }
      }
      bVar1 = false;
      iVar6 = QInputDevice::type();
      if (iVar6 == 2) {
        pQVar8 = findClosestTouchPointTarget
                           ((QApplicationPrivate *)
                            CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                            (QPointingDevice *)in_RDI,(QEventPoint *)in_RSI);
        QPointer<QObject>::data((QPointer<QObject> *)0x2d542a);
        if ((pQVar8 != (QWidget *)0x0) &&
           ((bVar3 = QWidget::isAncestorOf
                               ((QWidget *)
                                CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                                in_stack_fffffffffffffe60), bVar3 ||
            (bVar3 = QWidget::isAncestorOf
                               ((QWidget *)
                                CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                                in_stack_fffffffffffffe60), bVar3)))) {
          QPointer<QObject>::operator=
                    ((QPointer<QObject> *)in_stack_fffffffffffffe60,
                     (QObject *)
                     CONCAT44(in_stack_fffffffffffffe5c,
                              CONCAT13(in_stack_fffffffffffffe5b,
                                       CONCAT12(in_stack_fffffffffffffe5a,
                                                CONCAT11(in_stack_fffffffffffffe59,
                                                         in_stack_fffffffffffffe58)))));
          bVar1 = true;
        }
      }
      iVar6 = QInputDevice::type();
      if ((iVar6 == 4) || (bVar1)) {
        ::QPointer::operator_cast_to_QObject_((QPointer<QObject> *)0x2d54a5);
        QMutableEventPoint::setTarget
                  ((QEventPoint *)in_stack_fffffffffffffe60,
                   (QObject *)
                   CONCAT44(in_stack_fffffffffffffe5c,
                            CONCAT13(in_stack_fffffffffffffe5b,
                                     CONCAT12(in_stack_fffffffffffffe5a,
                                              CONCAT11(in_stack_fffffffffffffe59,
                                                       in_stack_fffffffffffffe58)))));
        in_stack_fffffffffffffe70 = pQVar10;
      }
LAB_002d54ee:
      QPointer<QObject>::data((QPointer<QObject> *)0x2d54fb);
      in_stack_fffffffffffffe98 =
           (QWidget *)
           QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>::operator[]
                     ((QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_> *)
                      in_stack_fffffffffffffe70,
                      (QWidget **)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      in_stack_fffffffffffffe6c = (Type)(byte)in_stack_fffffffffffffe98->super_QObject;
      SVar4 = QEventPoint::state();
      in_stack_fffffffffffffe98->super_QObject = (QObject)((State)in_stack_fffffffffffffe6c | SVar4)
      ;
      QList<QEventPoint>::append
                ((QList<QEventPoint> *)in_stack_fffffffffffffe60,
                 (parameter_type)
                 CONCAT44(in_stack_fffffffffffffe5c,
                          CONCAT13(in_stack_fffffffffffffe5b,
                                   CONCAT12(in_stack_fffffffffffffe5a,
                                            CONCAT11(in_stack_fffffffffffffe59,
                                                     in_stack_fffffffffffffe58)))));
      pQVar8 = in_stack_fffffffffffffe78;
    }
    else {
      QMutableEventPoint::target((QEventPoint *)0x2d54be);
      QPointer<QObject>::operator=
                ((QPointer<QObject> *)in_stack_fffffffffffffe60,
                 (QObject *)
                 CONCAT44(in_stack_fffffffffffffe5c,
                          CONCAT13(in_stack_fffffffffffffe5b,
                                   CONCAT12(in_stack_fffffffffffffe5a,
                                            CONCAT11(in_stack_fffffffffffffe59,
                                                     in_stack_fffffffffffffe58)))));
      bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QObject> *)0x2d54db);
      pQVar8 = in_stack_fffffffffffffe78;
      if (bVar1) goto LAB_002d54ee;
    }
LAB_002d5571:
    QPointer<QObject>::~QPointer((QPointer<QObject> *)0x2d557e);
    QList<QEventPoint>::iterator::operator++(&local_80);
    in_stack_fffffffffffffe78 = pQVar8;
  }
  bVar1 = QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>::isEmpty(&local_60);
  if (bVar1) {
    bVar5 = 0;
  }
  else {
    in_stack_fffffffffffffe94 = in_stack_fffffffffffffe94 & 0xffffff;
    QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>::constBegin
              ((QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_> *)
               in_stack_fffffffffffffe78);
    QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>::constEnd
              ((QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_> *)
               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    while (bVar1 = QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>::
                   const_iterator::operator!=
                             ((const_iterator *)
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                              (const_iterator *)in_stack_fffffffffffffe60), bVar1) {
      QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>::const_iterator::key
                ((const_iterator *)0x2d568a);
      QPointer<QWidget>::QPointer<void>
                ((QPointer<QWidget> *)in_stack_fffffffffffffe60,
                 (QWidget *)
                 CONCAT44(in_stack_fffffffffffffe5c,
                          CONCAT13(in_stack_fffffffffffffe5b,
                                   CONCAT12(in_stack_fffffffffffffe5a,
                                            CONCAT11(in_stack_fffffffffffffe59,
                                                     in_stack_fffffffffffffe58)))));
      ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x2d56a7);
      bVar1 = tryModalHelper((QWidget *)
                             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                             (QWidget **)in_stack_fffffffffffffe60);
      if (bVar1) {
        ppVar9 = QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>::
                 const_iterator::value((const_iterator *)0x2d56d9);
        in_stack_fffffffffffffe68 = (uint)ppVar9->first;
        if (in_stack_fffffffffffffe68 == 1) {
          in_stack_fffffffffffffe5c = 0xc2;
        }
        else {
          if (in_stack_fffffffffffffe68 == 4) goto LAB_002d59f0;
          if (in_stack_fffffffffffffe68 == 8) {
            in_stack_fffffffffffffe5c = 0xc4;
          }
          else {
            in_stack_fffffffffffffe5c = 0xc3;
          }
        }
        in_stack_fffffffffffffe60 = this;
        memset(local_58,0xaa,0x50);
        uVar11 = in_stack_fffffffffffffe5c;
        this = in_stack_fffffffffffffe60;
        QGuiApplication::keyboardModifiers();
        QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>::const_iterator::value
                  ((const_iterator *)0x2d5765);
        QMutableTouchEvent::QMutableTouchEvent
                  ((QMutableTouchEvent *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                   (QPointingDevice *)in_stack_fffffffffffffe60,
                   (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
                   SUB84((ulong)in_stack_fffffffffffffe78 >> 0x20,0),
                   (QList<QEventPoint> *)
                   CONCAT44(in_stack_fffffffffffffe5c,
                            CONCAT13(in_stack_fffffffffffffe5b,
                                     CONCAT12(in_stack_fffffffffffffe5a,
                                              CONCAT11(in_stack_fffffffffffffe59,
                                                       in_stack_fffffffffffffe58)))));
        ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x2d5793);
        bVar1 = updateTouchPointsForWidget
                          (in_stack_fffffffffffffe98,
                           (QTouchEvent *)CONCAT44(in_stack_fffffffffffffe94,uVar11));
        QInputEvent::timestamp((QInputEvent *)in_RSI);
        QPointerEvent::setTimestamp((ulonglong)local_58);
        pQVar10 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x2d57d3);
        QMutableTouchEvent::setTarget(local_58,&pQVar10->super_QObject);
        if (bVar1) {
          QPointer<QWidget>::operator->((QPointer<QWidget> *)0x2d57f7);
          QWidget::setAttribute
                    (this,(WidgetAttribute)((ulong)ppuVar12 >> 0x20),
                     SUB81((ulong)ppuVar12 >> 0x18,0));
        }
        TVar7 = QEvent::type((QEvent *)local_58);
        if (TVar7 == TouchBegin) {
          bVar1 = QEvent::spontaneous((QEvent *)in_RSI);
          if (bVar1) {
            pQVar10 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x2d5843);
            in_stack_fffffffffffffe5b =
                 QCoreApplication::sendSpontaneousEvent(&pQVar10->super_QObject,(QEvent *)local_58);
          }
          else {
            pQVar10 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x2d5866);
            in_stack_fffffffffffffe5b =
                 QCoreApplication::sendEvent(&pQVar10->super_QObject,(QEvent *)local_58);
          }
          if (((in_stack_fffffffffffffe5b & 1) != 0) &&
             (bVar1 = QEvent::isAccepted((QEvent *)local_58), bVar1)) {
            in_stack_fffffffffffffe94 = CONCAT13(1,(int3)in_stack_fffffffffffffe94);
            bVar1 = QPointer<QWidget>::isNull((QPointer<QWidget> *)0x2d58b0);
            if (!bVar1) {
              QPointer<QWidget>::operator->((QPointer<QWidget> *)0x2d58c1);
              QWidget::setAttribute
                        (this,(WidgetAttribute)((ulong)ppuVar12 >> 0x20),
                         SUB81((ulong)ppuVar12 >> 0x18,0));
            }
          }
        }
        else {
          QPointer<QWidget>::operator->((QPointer<QWidget> *)0x2d58e7);
          bVar1 = QWidget::testAttribute
                            ((QWidget *)
                             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                             (WidgetAttribute)((ulong)in_stack_fffffffffffffe60 >> 0x20));
          if (!bVar1) {
            ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x2d5905);
            bVar1 = QGestureManager::gesturePending
                              ((QObject *)
                               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
            if (!bVar1) goto LAB_002d59db;
          }
          bVar1 = QEvent::spontaneous((QEvent *)in_RSI);
          if (bVar1) {
            pQVar10 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x2d5936);
            in_stack_fffffffffffffe5a =
                 QCoreApplication::sendSpontaneousEvent(&pQVar10->super_QObject,(QEvent *)local_58);
          }
          else {
            pQVar10 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x2d5959);
            in_stack_fffffffffffffe5a =
                 QCoreApplication::sendEvent(&pQVar10->super_QObject,(QEvent *)local_58);
          }
          if (((in_stack_fffffffffffffe5a & 1) != 0) &&
             (bVar1 = QEvent::isAccepted((QEvent *)local_58), bVar1)) {
            in_stack_fffffffffffffe94 = CONCAT13(1,(int3)in_stack_fffffffffffffe94);
          }
          TVar7 = QEvent::type((QEvent *)local_58);
          if ((TVar7 == TouchEnd) &&
             (bVar1 = QPointer<QWidget>::isNull((QPointer<QWidget> *)0x2d59b7), !bVar1)) {
            QPointer<QWidget>::operator->((QPointer<QWidget> *)0x2d59c8);
            QWidget::setAttribute
                      (this,(WidgetAttribute)((ulong)ppuVar12 >> 0x20),
                       SUB81((ulong)ppuVar12 >> 0x18,0));
          }
        }
LAB_002d59db:
        QMutableTouchEvent::~QMutableTouchEvent(local_58);
      }
LAB_002d59f0:
      QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x2d59fd);
      QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>::const_iterator::
      operator++((const_iterator *)in_stack_fffffffffffffe70);
    }
    bVar5 = (byte)(in_stack_fffffffffffffe94 >> 0x18) & 1;
  }
  QList<QEventPoint>::~QList((QList<QEventPoint> *)0x2d5a3f);
  QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>::~QHash
            ((QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_> *)
             in_stack_fffffffffffffe60);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool QApplicationPrivate::translateRawTouchEvent(QWidget *window, const QTouchEvent *te)
{
    QApplicationPrivate *d = self;
    // TODO get rid of this std::pair
    typedef std::pair<QEventPoint::State, QList<QEventPoint> > StatesAndTouchPoints;
    QHash<QWidget *, StatesAndTouchPoints> widgetsNeedingEvents;

    const auto *device = te->pointingDevice();
    auto touchPoints = te->points(); // touch points will be mutated
    for (auto &touchPoint : touchPoints) {
        // update state
        QPointer<QObject> target;
        if (touchPoint.state() == QEventPoint::State::Pressed) {
            if (device->type() == QInputDevice::DeviceType::TouchPad) {
                // on touchpads, send all touch points to the same widget:
                // pick the first non-null target if possible
                target = QPointingDevicePrivate::get(device)->firstActiveTarget();
            }

            if (target.isNull()) {
                // determine which widget this event will go to
                if (!window)
                    window = QApplication::topLevelAt(touchPoint.globalPosition().toPoint());
                if (!window)
                    continue;
                target = window->childAt(window->mapFromGlobal(touchPoint.globalPosition().toPoint()));
                if (!target)
                    target = window;
            }

            bool usingClosestWidget = false;
            if (device->type() == QInputDevice::DeviceType::TouchScreen) {
                QWidget *closestWidget = d->findClosestTouchPointTarget(device, touchPoint);
                QWidget *widget = static_cast<QWidget *>(target.data());
                if (closestWidget
                        && (widget->isAncestorOf(closestWidget) || closestWidget->isAncestorOf(widget))) {
                    target = closestWidget;
                    usingClosestWidget = true;
                }
            }

            // on touch pads, implicitly grab all touch points
            // on touch screens, grab touch points that are redirected to the closest widget
            if (device->type() == QInputDevice::DeviceType::TouchPad || usingClosestWidget)
                QMutableEventPoint::setTarget(touchPoint, target);
        } else {
            target = QMutableEventPoint::target(touchPoint);
            if (!target)
                continue;
        }
        Q_ASSERT(!target.isNull());

        QWidget *targetWidget = static_cast<QWidget *>(target.data());

#ifdef Q_OS_MACOS
        // Single-touch events are normally not sent unless WA_TouchPadAcceptSingleTouchEvents is set.
        // In Qt 4 this check was in OS X-only code. That behavior is preserved here by the #ifdef.
        if (touchPoints.count() == 1
            && device->type() == QInputDevice::DeviceType::TouchPad
            && !targetWidget->testAttribute(Qt::WA_TouchPadAcceptSingleTouchEvents))
            continue;
#endif

        StatesAndTouchPoints &maskAndPoints = widgetsNeedingEvents[targetWidget];
        maskAndPoints.first = QEventPoint::State(maskAndPoints.first | touchPoint.state());
        maskAndPoints.second.append(touchPoint);
    }

    if (widgetsNeedingEvents.isEmpty())
        return false;

    bool accepted = false;
    QHash<QWidget *, StatesAndTouchPoints>::ConstIterator it = widgetsNeedingEvents.constBegin();
    const QHash<QWidget *, StatesAndTouchPoints>::ConstIterator end = widgetsNeedingEvents.constEnd();
    for (; it != end; ++it) {
        const QPointer<QWidget> widget = it.key();
        if (!QApplicationPrivate::tryModalHelper(widget, nullptr))
            continue;

        QEvent::Type eventType;
        switch (it.value().first) {
        case QEventPoint::State::Pressed:
            eventType = QEvent::TouchBegin;
            break;
        case QEventPoint::State::Released:
            eventType = QEvent::TouchEnd;
            break;
        case QEventPoint::State::Stationary:
            // don't send the event if nothing changed
            continue;
        default:
            eventType = QEvent::TouchUpdate;
            break;
        }

        QMutableTouchEvent touchEvent(eventType, device, QGuiApplication::keyboardModifiers(),
                                      it.value().second);
        bool containsPress = updateTouchPointsForWidget(widget, &touchEvent);
        touchEvent.setTimestamp(te->timestamp());
        touchEvent.setTarget(widget);

        if (containsPress)
            widget->setAttribute(Qt::WA_WState_AcceptedTouchBeginEvent);

        switch (touchEvent.type()) {
        case QEvent::TouchBegin:
        {
            // if the TouchBegin handler recurses, we assume that means the event
            // has been implicitly accepted and continue to send touch events
            bool res = te->spontaneous() ? QApplication::sendSpontaneousEvent(widget, &touchEvent)
                                         : QApplication::sendEvent(widget, &touchEvent);
            if (res && touchEvent.isAccepted()) {
                accepted = true;
                if (!widget.isNull())
                    widget->setAttribute(Qt::WA_WState_AcceptedTouchBeginEvent);
            }
            break;
        }
        default:
            if (widget->testAttribute(Qt::WA_WState_AcceptedTouchBeginEvent)
#ifndef QT_NO_GESTURES
                || QGestureManager::gesturePending(widget)
#endif
                ) {
                bool res = te->spontaneous() ? QApplication::sendSpontaneousEvent(widget, &touchEvent)
                                            : QApplication::sendEvent(widget, &touchEvent);
                if (res && touchEvent.isAccepted())
                    accepted = true;
                // widget can be deleted on TouchEnd
                if (touchEvent.type() == QEvent::TouchEnd && !widget.isNull())
                    widget->setAttribute(Qt::WA_WState_AcceptedTouchBeginEvent, false);
            }
            break;
        }
    }
    return accepted;
}